

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_csvmodelserialiser.cpp
# Opt level: O2

void __thiscall
tst_CsvModelSerialiser::basicSaveLoadData(tst_CsvModelSerialiser *this,QObject *parent)

{
  tst_SerialiserCommon *this_00;
  QTestData *pQVar1;
  QStringListModel *this_01;
  QStandardItemModel *this_02;
  QStringListModel *local_38;
  QAbstractItemModel *local_30;
  
  QTest::addColumn<QAbstractItemModel_const*>("sourceModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QAbstractItemModel*>("destinationModel",(QAbstractItemModel **)0x0);
  pQVar1 = (QTestData *)QTest::newRow("List Single Role");
  this_00 = &this->super_tst_SerialiserCommon;
  local_30 = tst_SerialiserCommon::createStringModel(this_00,&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_30);
  this_01 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_01,&this->super_QObject);
  local_38 = this_01;
  operator<<(pQVar1,(QAbstractItemModel **)&local_38);
  pQVar1 = (QTestData *)QTest::newRow("List Single Role Overwrite");
  local_30 = tst_SerialiserCommon::createStringModel(this_00,&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_30);
  local_38 = (QStringListModel *)
             tst_SerialiserCommon::createStringModel(this_00,&this->super_QObject);
  operator<<(pQVar1,(QAbstractItemModel **)&local_38);
  pQVar1 = (QTestData *)QTest::newRow("Table Single Role");
  local_30 = tst_SerialiserCommon::createComplexModel(this_00,false,false,&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_30);
  this_02 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_02,&this->super_QObject);
  local_38 = (QStringListModel *)this_02;
  operator<<(pQVar1,(QAbstractItemModel **)&local_38);
  pQVar1 = (QTestData *)QTest::newRow("Table Single Role Overwrite");
  local_30 = tst_SerialiserCommon::createComplexModel(this_00,false,false,&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_30);
  local_38 = (QStringListModel *)
             tst_SerialiserCommon::createComplexModel(this_00,false,false,&this->super_QObject);
  operator<<(pQVar1,(QAbstractItemModel **)&local_38);
  return;
}

Assistant:

void tst_CsvModelSerialiser::basicSaveLoadData(QObject *parent)
{
    Q_UNUSED(parent)
    QTest::addColumn<const QAbstractItemModel *>("sourceModel");
    QTest::addColumn<QAbstractItemModel *>("destinationModel");
    QTest::newRow("List Single Role") << static_cast<const QAbstractItemModel *>(createStringModel(this))
                                      << static_cast<QAbstractItemModel *>(new QStringListModel(this));
    QTest::newRow("List Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createStringModel(this)) << createStringModel(this);
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::newRow("Table Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, this))
                                       << static_cast<QAbstractItemModel *>(new ComplexModel(this));
    QTest::newRow("Table Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, this))
                                                 << createComplexModel(false, false, this);
#endif
}